

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

bool __thiscall
slang::ast::BinaryExpression::propagateType
          (BinaryExpression *this,ASTContext *context,Type *newType,SourceRange propRange,
          ConversionKind param_5)

{
  SourceRange opRange;
  SourceRange opRange_00;
  SourceRange opRange_01;
  bool bVar1;
  SourceLocation in_RCX;
  Type *in_RDX;
  long in_RDI;
  SourceLocation in_R8;
  Type *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff58;
  uint uVar2;
  Type *in_stack_ffffffffffffff78;
  Expression *in_stack_ffffffffffffff80;
  Type *in_stack_ffffffffffffff88;
  not_null<const_slang::ast::Type_*> in_stack_ffffffffffffff90;
  SourceLocation in_stack_ffffffffffffff98;
  SourceLocation in_stack_ffffffffffffffa0;
  ConversionKind in_stack_ffffffffffffffb0;
  SourceLocation SVar3;
  Type *local_48;
  not_null<const_slang::ast::Type_*> local_40 [5];
  SourceLocation local_18;
  SourceLocation local_10;
  bool local_1;
  
  uVar2 = *(uint *)(in_RDI + 0x40);
  local_18 = in_RCX;
  local_10 = in_R8;
  if (uVar2 < 9) {
    not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>(local_40,&local_48);
    *(Type **)(in_RDI + 8) = local_40[0].ptr;
    opRange.endLoc = in_stack_ffffffffffffffa0;
    opRange.startLoc = in_stack_ffffffffffffff98;
    SVar3 = local_10;
    Expression::contextDetermined
              ((ASTContext *)in_stack_ffffffffffffff90.ptr,(Expression **)in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,opRange,local_10._0_4_);
    opRange_00.endLoc = local_10;
    opRange_00.startLoc = local_18;
    Expression::contextDetermined
              ((ASTContext *)in_stack_ffffffffffffff90.ptr,(Expression **)in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,opRange_00,SVar3._0_4_);
    local_1 = true;
  }
  else if (uVar2 - 9 < 0xe) {
    local_1 = false;
  }
  else {
    not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
              ((not_null<const_slang::ast::Type_*> *)&stack0xffffffffffffff90,
               (Type **)&stack0xffffffffffffff88);
    *(Type **)(in_RDI + 8) = in_stack_ffffffffffffff90.ptr;
    opRange_01.endLoc = in_stack_ffffffffffffffa0;
    opRange_01.startLoc = in_stack_ffffffffffffff98;
    Expression::contextDetermined
              ((ASTContext *)in_stack_ffffffffffffff90.ptr,(Expression **)in_RDX,
               (Expression *)local_10,(Type *)local_18,opRange_01,in_stack_ffffffffffffffb0);
    if (*(int *)(in_RDI + 0x40) == 0x1a) {
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xbd00b6)
      ;
      bVar1 = Type::isSigned(in_stack_ffffffffffffff40);
      if (!bVar1) {
        ASTContext::addDiag((ASTContext *)CONCAT44(uVar2,in_stack_ffffffffffffff58),
                            (DiagCode)0xd70007,*(SourceRange *)(*(long *)(in_RDI + 0x30) + 0x20));
        not_null<const_slang::ast::Type_*>::operator*
                  ((not_null<const_slang::ast::Type_*> *)0xbd0115);
        ast::operator<<((Diagnostic *)in_stack_ffffffffffffff90.ptr,in_RDX);
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool BinaryExpression::propagateType(const ASTContext& context, const Type& newType,
                                     SourceRange propRange, ConversionKind) {
    switch (op) {
        case BinaryOperator::Add:
        case BinaryOperator::Subtract:
        case BinaryOperator::Multiply:
        case BinaryOperator::Divide:
        case BinaryOperator::Mod:
        case BinaryOperator::BinaryAnd:
        case BinaryOperator::BinaryOr:
        case BinaryOperator::BinaryXor:
        case BinaryOperator::BinaryXnor:
            type = &newType;
            contextDetermined(context, left_, this, newType, propRange);
            contextDetermined(context, right_, this, newType, propRange);
            return true;
        case BinaryOperator::Equality:
        case BinaryOperator::Inequality:
        case BinaryOperator::CaseEquality:
        case BinaryOperator::CaseInequality:
        case BinaryOperator::GreaterThanEqual:
        case BinaryOperator::GreaterThan:
        case BinaryOperator::LessThanEqual:
        case BinaryOperator::LessThan:
        case BinaryOperator::WildcardEquality:
        case BinaryOperator::WildcardInequality:
        case BinaryOperator::LogicalAnd:
        case BinaryOperator::LogicalOr:
        case BinaryOperator::LogicalImplication:
        case BinaryOperator::LogicalEquivalence:
            // Type is already set (always 1 bit) and operands are already folded.
            return false;
        case BinaryOperator::LogicalShiftLeft:
        case BinaryOperator::LogicalShiftRight:
        case BinaryOperator::ArithmeticShiftLeft:
        case BinaryOperator::ArithmeticShiftRight:
        case BinaryOperator::Power:
            // Only the left hand side gets propagated; the rhs is self determined.
            type = &newType;
            contextDetermined(context, left_, this, newType, propRange);
            if (op == BinaryOperator::ArithmeticShiftRight && !type->isSigned())
                context.addDiag(diag::UnsignedArithShift, left_->sourceRange) << *type;
            return true;
    }
    SLANG_UNREACHABLE;
}